

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-mqtt.c
# Opt level: O0

int rops_handle_POLLOUT_mqtt(lws *wsi)

{
  int iVar1;
  lws *wsi_00;
  lws *wsi_01;
  bool bVar2;
  uint8_t buf_1 [20];
  lws **local_48;
  lws **wa;
  lws *w;
  uint8_t buf [18];
  lws **wsi2;
  lws *wsi_local;
  
  _lws_log(0x10,"%s\n","rops_handle_POLLOUT_mqtt");
  if (((wsi->mqtt == (_lws_mqtt_related *)0x0) || ((wsi->mqtt->field_0xfe & 1) == 0)) ||
     (((byte)wsi->mqtt->field_0xfe >> 2 & 1) != 0)) {
    wsi_00 = lws_get_network_wsi(wsi);
    (wsi_00->mux).requested_POLLOUT = '\0';
    register0x00000000 = &(wsi_00->mux).child_list;
    if (*register0x00000000 == (lws *)0x0) {
      _lws_log(0x10,"%s: no children\n","rops_handle_POLLOUT_mqtt");
      wsi_local._4_4_ = 3;
    }
    else {
      lws_wsi_mux_dump_waiting_children(wsi_00);
      do {
        local_48 = &((*stack0xffffffffffffffe0)->mux).sibling_list;
        if (((((*stack0xffffffffffffffe0)->mux).requested_POLLOUT != '\0') &&
            ((wsi_00->wsistate & 0x100) != 0)) &&
           ((((byte)wsi_00->mqtt->field_0xfe >> 2 & 1) == 0 ||
            (((byte)(*stack0xffffffffffffffe0)->mqtt->field_0xfe >> 2 & 1) != 0)))) {
          wsi_01 = lws_wsi_mux_move_child_to_tail(stack0xffffffffffffffe0);
          if (wsi_01 == (lws *)0x0) {
            local_48 = &(wsi_00->mux).child_list;
          }
          else {
            _lws_log(0x10,"%s: child %p (wsistate 0x%x)\n","rops_handle_POLLOUT_mqtt",wsi_01,
                     (ulong)wsi_01->wsistate);
            if ((((wsi_00->wsistate & 0xffff) == 0x119) &&
                (((byte)wsi_00->mqtt->field_0xfe >> 2 & 1) == 0)) &&
               (((byte)wsi_00->mqtt->field_0xfe >> 5 & 1) != 0)) {
              _lws_log(4,"%s: issuing PUBACK for pkt id: %d\n","rops_handle_POLLOUT_mqtt",
                       (ulong)wsi_00->mqtt->ack_pkt_id);
              buf_1[8] = '@';
              buf_1[9] = '\x02';
              lws_ser_wu16be(buf_1 + 10,wsi_00->mqtt->ack_pkt_id);
              iVar1 = lws_write(wsi_00,buf_1 + 8,4,LWS_WRITE_BINARY);
              if (iVar1 != 4) {
                return 1;
              }
              wsi_00->mqtt->field_0xfe = wsi_00->mqtt->field_0xfe & 0xdf;
              (wsi_01->mux).requested_POLLOUT = '\x01';
              local_48 = &(wsi_00->mux).child_list;
            }
            else {
              iVar1 = lws_callback_as_writeable(wsi_01);
              if (iVar1 != 0) {
                _lws_log(4,"%s: Closing child %p\n","rops_handle_POLLOUT_mqtt",wsi_01);
                lws_close_free_wsi(wsi_01,LWS_CLOSE_STATUS_NOSTATUS,"mqtt pollout handle");
                local_48 = &(wsi_00->mux).child_list;
              }
            }
          }
        }
        stack0xffffffffffffffe0 = local_48;
        bVar2 = false;
        if ((local_48 != (lws **)0x0) && (bVar2 = false, *local_48 != (lws *)0x0)) {
          iVar1 = lws_send_pipe_choked(wsi_00);
          bVar2 = iVar1 == 0;
        }
      } while (bVar2);
      iVar1 = lws_wsi_mux_action_pending_writeable_reqs(wsi_00);
      if (iVar1 == 0) {
        wsi_local._4_4_ = 0;
      }
      else {
        wsi_local._4_4_ = 1;
      }
    }
  }
  else {
    wsi->mqtt->field_0xfe = wsi->mqtt->field_0xfe & 0xfe;
    _lws_log(4,"%s: issuing PINGREQ\n","rops_handle_POLLOUT_mqtt");
    buf[8] = 0xc0;
    buf[9] = '\0';
    iVar1 = lws_write(wsi,buf + 8,2,LWS_WRITE_BINARY);
    if (iVar1 == 2) {
      wsi_local._4_4_ = 0;
    }
    else {
      wsi_local._4_4_ = 1;
    }
  }
  return wsi_local._4_4_;
}

Assistant:

static int
rops_handle_POLLOUT_mqtt(struct lws *wsi)
{
	struct lws **wsi2;

	lwsl_debug("%s\n", __func__);

#if defined(LWS_WITH_CLIENT)
	if (wsi->mqtt && wsi->mqtt->send_pingreq && !wsi->mqtt->inside_payload) {
		uint8_t buf[LWS_PRE + 2];

		/*
		 * We are swallowing this POLLOUT in order to send a PINGREQ
		 * autonomously
		 */

		wsi->mqtt->send_pingreq = 0;

		lwsl_notice("%s: issuing PINGREQ\n", __func__);

		buf[LWS_PRE] = LMQCP_CTOS_PINGREQ << 4;
		buf[LWS_PRE + 1] = 0;

		if (lws_write(wsi, (uint8_t *)&buf[LWS_PRE], 2,
			      LWS_WRITE_BINARY) != 2)
			return LWS_HP_RET_BAIL_DIE;

		return LWS_HP_RET_BAIL_OK;
	}
#endif

	wsi = lws_get_network_wsi(wsi);

	wsi->mux.requested_POLLOUT = 0;

	wsi2 = &wsi->mux.child_list;
	if (!*wsi2) {
		lwsl_debug("%s: no children\n", __func__);
		return LWS_HP_RET_DROP_POLLOUT;
	}

	lws_wsi_mux_dump_waiting_children(wsi);

	do {
		struct lws *w, **wa;

		wa = &(*wsi2)->mux.sibling_list;
		if (!(*wsi2)->mux.requested_POLLOUT)
			goto next_child;

		if (!lwsi_state_can_handle_POLLOUT(wsi))
			goto next_child;

		/*
		 * If the nwsi is in the middle of a frame, we can only
		 * continue to send that
		 */

		if (wsi->mqtt->inside_payload && !(*wsi2)->mqtt->inside_payload)
			goto next_child;

		/*
		 * we're going to do writable callback for this child.
		 * move him to be the last child
		 */
		w = lws_wsi_mux_move_child_to_tail(wsi2);
		if (!w) {
			wa = &wsi->mux.child_list;
			goto next_child;
		}

		lwsl_debug("%s: child %p (wsistate 0x%x)\n", __func__, w,
			    (unsigned int)w->wsistate);

		if (lwsi_state(wsi) == LRS_ESTABLISHED &&
		    !wsi->mqtt->inside_payload &&
		    wsi->mqtt->send_puback) {
			uint8_t buf[LWS_PRE + 4];
			lwsl_notice("%s: issuing PUBACK for pkt id: %d\n",
				    __func__, wsi->mqtt->ack_pkt_id);

			/* Fixed header */
			buf[LWS_PRE] = LMQCP_PUBACK << 4;
			/* Remaining len = 2 */
			buf[LWS_PRE + 1] = 2;
			/* Packet ID */
			lws_ser_wu16be(&buf[LWS_PRE + 2], wsi->mqtt->ack_pkt_id);

			if (lws_write(wsi, (uint8_t *)&buf[LWS_PRE], 4,
				      LWS_WRITE_BINARY) != 4)
				return LWS_HP_RET_BAIL_DIE;

			wsi->mqtt->send_puback = 0;
			w->mux.requested_POLLOUT = 1;

			wa = &wsi->mux.child_list;
			goto next_child;
		}

		if (lws_callback_as_writeable(w)) {
			lwsl_notice("%s: Closing child %p\n", __func__, w);
			lws_close_free_wsi(w, LWS_CLOSE_STATUS_NOSTATUS,
					   "mqtt pollout handle");
			wa = &wsi->mux.child_list;
		}

next_child:
		wsi2 = wa;
	} while (wsi2 && *wsi2 && !lws_send_pipe_choked(wsi));

	// lws_wsi_mux_dump_waiting_children(wsi);

	if (lws_wsi_mux_action_pending_writeable_reqs(wsi))
		return LWS_HP_RET_BAIL_DIE;

	return LWS_HP_RET_BAIL_OK;
}